

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastDivider(Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,Vec_Int_t *vRes
                     )

{
  int iCtrl;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iData1;
  int *piVar5;
  int *pArray;
  int *pArray_00;
  ulong uVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int *local_58;
  int *local_48;
  
  piVar5 = Wlc_VecCopy(vRes,pNum,nNum);
  pArray = (int *)malloc((long)nNum * 4);
  pArray_00 = (int *)malloc((long)nNum * 4);
  if (nNum != nDiv) {
    __assert_fail("nNum == nDiv",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x1ae,
                  "void Wlc_BlastDivider(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
  }
  lVar8 = (long)(nNum + -1);
  uVar6 = 0;
  if (0 < nNum) {
    uVar6 = (ulong)(uint)nNum;
  }
  local_48 = pDiv + -lVar8;
  lVar10 = lVar8;
  local_58 = pDiv;
  do {
    if (lVar10 < 0) {
      free(pArray_00);
      if (fQuo != 0) {
        Wlc_VecCopy(vRes,pArray,nNum);
      }
      free(pArray);
      return;
    }
    iVar1 = 0;
    lVar12 = lVar8;
    do {
      piVar7 = local_58;
      lVar9 = lVar8;
      iVar4 = iVar1;
      if (lVar12 <= lVar8 - lVar10) goto LAB_002c5922;
      iVar1 = Gia_ManHashOr(pNew,iVar1,pDiv[lVar12]);
      lVar12 = lVar12 + -1;
    } while (iVar1 != 1);
    iVar1 = 1;
    iVar4 = iVar1;
LAB_002c5922:
    while ((-1 < lVar9 && (iVar4 != 1))) {
      iVar3 = 0;
      if (lVar10 <= lVar9) {
        iVar3 = *piVar7;
      }
      iVar2 = Abc_LitNot(piVar5[lVar9]);
      iVar2 = Gia_ManHashAnd(pNew,iVar3,iVar2);
      iVar1 = Gia_ManHashMux(pNew,iVar4,iVar1,iVar2);
      pArray[lVar10] = iVar1;
      iVar3 = Gia_ManHashXor(pNew,iVar3,piVar5[lVar9]);
      iVar4 = Gia_ManHashOr(pNew,iVar4,iVar3);
      piVar7 = piVar7 + -1;
      lVar9 = lVar9 + -1;
    }
    iVar1 = Abc_LitNot(iVar1);
    pArray[lVar10] = iVar1;
    if (iVar1 != 0) {
      iVar4 = 0;
      for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
        iVar3 = Abc_LitNot(piVar5[uVar11]);
        iVar2 = Gia_ManHashMux(pNew,iVar4,iVar3,piVar5[uVar11]);
        iVar3 = 0;
        if (lVar10 <= (long)uVar11) {
          iVar3 = local_48[uVar11];
        }
        iCtrl = piVar5[uVar11];
        iData1 = Gia_ManHashAnd(pNew,iVar4,iVar3);
        iVar4 = Gia_ManHashOr(pNew,iVar4,iVar3);
        iVar4 = Gia_ManHashMux(pNew,iCtrl,iData1,iVar4);
        iVar3 = Gia_ManHashXor(pNew,iVar2,iVar3);
        pArray_00[uVar11] = iVar3;
      }
      if (iVar1 == 1) {
        Wlc_VecCopy(vRes,pArray_00,nNum);
      }
      else {
        for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
          iVar4 = Gia_ManHashMux(pNew,iVar1,pArray_00[uVar11],piVar5[uVar11]);
          piVar5[uVar11] = iVar4;
        }
      }
    }
    lVar10 = lVar10 + -1;
    local_58 = local_58 + 1;
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void Wlc_BlastDivider( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    int * pRes  = Wlc_VecCopy( vRes, pNum, nNum );
    int * pQuo  = ABC_ALLOC( int, nNum );
    int * pTemp = ABC_ALLOC( int, nNum );
    int i, j, known, borrow, y_bit, top_bit;
    assert( nNum == nDiv );
    for ( j = nNum - 1; j >= 0; j-- ) 
    {
        known = 0;
        for ( i = nNum - 1; i > nNum - 1 - j; i-- ) 
        {
            known = Gia_ManHashOr( pNew, known, pDiv[i] );
            if( known == 1 ) 
                break;
        }
        pQuo[j] = known;
        for ( i = nNum - 1; i >= 0; i-- ) 
        {
            if ( known == 1 ) 
                break;
            y_bit = (i >= j) ? pDiv[i-j] : 0;
            pQuo[j] = Gia_ManHashMux( pNew, known, pQuo[j], Gia_ManHashAnd( pNew, y_bit, Abc_LitNot(pRes[i]) ) );
            known = Gia_ManHashOr( pNew, known, Gia_ManHashXor(pNew, y_bit, pRes[i]));
        }
        pQuo[j] = Abc_LitNot(pQuo[j]);
        if ( pQuo[j] == 0 )
            continue;
        borrow = 0;
        for ( i = 0; i < nNum; i++ ) 
        {
            top_bit  = Gia_ManHashMux( pNew, borrow, Abc_LitNot(pRes[i]), pRes[i] );
            y_bit    = (i >= j) ? pDiv[i-j] : 0;
            borrow   = Gia_ManHashMux( pNew, pRes[i], Gia_ManHashAnd(pNew, borrow, y_bit), Gia_ManHashOr(pNew, borrow, y_bit) );
            pTemp[i] = Gia_ManHashXor( pNew, top_bit, y_bit );
        }
        if ( pQuo[j] == 1 ) 
            Wlc_VecCopy( vRes, pTemp, nNum );
        else 
            for( i = 0; i < nNum; i++ ) 
                pRes[i] = Gia_ManHashMux( pNew, pQuo[j], pTemp[i], pRes[i] );
    }
    ABC_FREE( pTemp );
    if ( fQuo )
        Wlc_VecCopy( vRes, pQuo, nNum );
    ABC_FREE( pQuo );
}